

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O3

Map_Node_t * Map_NodeAnd(Map_Man_t *pMan,Map_Node_t *p1,Map_Node_t *p2)

{
  int iVar1;
  uint uVar2;
  Map_Node_t **ppMVar3;
  Map_Node_t *pMVar4;
  uint uVar5;
  Map_Node_t *pMVar6;
  Map_Node_t **ppMVar7;
  ulong uVar8;
  Map_Node_t *pMVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  timespec ts;
  timespec local_40;
  
  if (p1 != p2) {
    if ((Map_Node_t *)((ulong)p2 ^ 1) == p1) {
      p1 = (Map_Node_t *)((ulong)pMan->pConst1 ^ 1);
    }
    else {
      iVar10 = *(int *)(((ulong)p1 & 0xfffffffffffffffe) + 0x10);
      if (iVar10 == -1) {
        pMVar9 = pMan->pConst1;
        if (pMVar9 == p1) {
          return p2;
        }
      }
      else {
        iVar1 = *(int *)(((ulong)p2 & 0xfffffffffffffffe) + 0x10);
        if (iVar1 != -1) {
          pMVar9 = p2;
          if (iVar1 < iVar10) {
            pMVar9 = p1;
            p1 = p2;
          }
          iVar10 = pMan->nBins;
          uVar13 = (long)pMVar9 * 0xc00005 + (long)p1;
          uVar15 = uVar13 % (ulong)(long)iVar10 & 0xffffffff;
          for (pMVar6 = pMan->pBins[uVar15]; pMVar6 != (Map_Node_t *)0x0; pMVar6 = pMVar6->pNext) {
            if ((pMVar6->p1 == p1) && (pMVar6->p2 == pMVar9)) {
              return pMVar6;
            }
          }
          if (SBORROW4(pMan->nNodes,iVar10 * 2) == pMan->nNodes + iVar10 * -2 < 0) {
            clock_gettime(3,&local_40);
            uVar2 = pMan->nBins;
            uVar11 = uVar2 * 2 - 1;
            while( true ) {
              do {
                uVar12 = uVar11 + 1;
                uVar5 = uVar11 & 1;
                uVar11 = uVar12;
              } while (uVar5 != 0);
              if (uVar12 < 9) break;
              iVar10 = 5;
              while (uVar12 % (iVar10 - 2U) != 0) {
                uVar5 = iVar10 * iVar10;
                iVar10 = iVar10 + 2;
                if (uVar12 < uVar5) goto LAB_003fd077;
              }
            }
LAB_003fd077:
            uVar15 = (ulong)(int)uVar12;
            ppMVar7 = (Map_Node_t **)calloc(1,uVar15 * 8);
            if ((int)uVar2 < 1) {
              iVar10 = 0;
            }
            else {
              ppMVar3 = pMan->pBins;
              uVar14 = 0;
              iVar10 = 0;
              do {
                pMVar6 = ppMVar3[uVar14];
                while (pMVar6 != (Map_Node_t *)0x0) {
                  pMVar4 = pMVar6->pNext;
                  uVar8 = (ulong)((long)pMVar6->p2 * 0xc00005 + (long)pMVar6->p1) % uVar15 &
                          0xffffffff;
                  pMVar6->pNext = ppMVar7[uVar8];
                  ppMVar7[uVar8] = pMVar6;
                  iVar10 = iVar10 + 1;
                  pMVar6 = pMVar4;
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar2);
            }
            if (iVar10 != pMan->nNodes - pMan->nInputs) {
              __assert_fail("Counter == pMan->nNodes - pMan->nInputs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCreate.c"
                            ,0x211,"void Map_TableResize(Map_Man_t *)");
            }
            if (pMan->pBins != (Map_Node_t **)0x0) {
              free(pMan->pBins);
            }
            pMan->pBins = ppMVar7;
            pMan->nBins = uVar12;
            uVar15 = uVar13 % uVar15 & 0xffffffff;
          }
          pMVar9 = Map_NodeCreate(pMan,p1,pMVar9);
          ppMVar7 = pMan->pBins;
          pMVar9->pNext = ppMVar7[uVar15];
          ppMVar7[uVar15] = pMVar9;
          return pMVar9;
        }
        pMVar9 = pMan->pConst1;
        if (pMVar9 == p2) {
          return p1;
        }
      }
      p1 = (Map_Node_t *)((ulong)pMVar9 ^ 1);
    }
  }
  return p1;
}

Assistant:

Map_Node_t * Map_NodeAnd( Map_Man_t * pMan, Map_Node_t * p1, Map_Node_t * p2 )
{
    Map_Node_t * pEnt;
    unsigned Key;

    if ( p1 == p2 )
        return p1;
    if ( p1 == Map_Not(p2) )
        return Map_Not(pMan->pConst1);
    if ( Map_NodeIsConst(p1) )
    {
        if ( p1 == pMan->pConst1 )
            return p2;
        return Map_Not(pMan->pConst1);
    }
    if ( Map_NodeIsConst(p2) )
    {
        if ( p2 == pMan->pConst1 )
            return p1;
        return Map_Not(pMan->pConst1);
    }

    if ( Map_Regular(p1)->Num > Map_Regular(p2)->Num )
        pEnt = p1, p1 = p2, p2 = pEnt;

    Key = Map_HashKey2( p1, p2, pMan->nBins );
    for ( pEnt = pMan->pBins[Key]; pEnt; pEnt = pEnt->pNext )
        if ( pEnt->p1 == p1 && pEnt->p2 == p2 )
            return pEnt;
    // resize the table
    if ( pMan->nNodes >= 2 * pMan->nBins )
    {
        Map_TableResize( pMan );
        Key = Map_HashKey2( p1, p2, pMan->nBins );
    }
    // create the new node
    pEnt = Map_NodeCreate( pMan, p1, p2 );
    // add the node to the corresponding linked list in the table
    pEnt->pNext = pMan->pBins[Key];
    pMan->pBins[Key] = pEnt;
    return pEnt;
}